

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O2

void convert<unsigned_short,signed_char>(vector<unsigned_char,_std::allocator<unsigned_char>_> *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  ulong uVar9;
  ulong uVar10;
  vector<signed_char,_std::allocator<signed_char>_> dst;
  key_type local_70;
  size_type local_68;
  key_type local_60;
  key_type local_58;
  key_type local_50;
  _Vector_base<signed_char,_std::allocator<signed_char>_> local_48;
  
  uVar6 = (ulong)((long)(src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) >> 1;
  iVar5 = (int)uVar6;
  sVar8 = (size_type)iVar5;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)&local_48,sVar8,
             (allocator_type *)&local_70);
  uVar9 = 0;
  uVar10 = 0;
  local_68 = sVar8;
  if (0 < iVar5) {
    uVar10 = uVar6 & 0xffffffff;
  }
  for (; sVar8 = local_68, uVar10 != uVar9; uVar9 = uVar9 + 1) {
    uVar4 = *(ushort *)
             ((src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start + uVar9 * 2);
    local_70._M_target = (type_info *)&unsigned_short::typeinfo;
    pmVar7 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleOffset,&local_70);
    fVar1 = *pmVar7;
    local_50._M_target = (type_info *)&unsigned_short::typeinfo;
    pmVar7 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleScale,&local_50);
    fVar2 = *pmVar7;
    local_58._M_target = (type_info *)&signed_char::typeinfo;
    pmVar7 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleScale,&local_58);
    fVar3 = *pmVar7;
    local_60._M_target = (type_info *)&signed_char::typeinfo;
    pmVar7 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleOffset,&local_60);
    local_48._M_impl.super__Vector_impl_data._M_start[uVar9] =
         (char)(int)((((float)uVar4 - fVar1) / fVar2) * fVar3 + *pmVar7);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(src,local_68);
  memcpy((src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start,local_48._M_impl.super__Vector_impl_data._M_start,sVar8);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void convert(std::vector<uint8_t> & src) {
    const int n = src.size()/sizeof(S);
    std::vector<D> dst(n);
    S v;
    for (int i = 0; i < n; ++i) {
        std::memcpy(&v, &src[i*sizeof(S)], sizeof(S));
        dst[i] = ((float(v) - kSampleOffset.at(typeid(S)))/kSampleScale.at(typeid(S)))*kSampleScale.at(typeid(D)) + kSampleOffset.at(typeid(D));
    }

    src.resize(n*sizeof(D));
    std::memcpy(&src[0], &dst[0], n*sizeof(D));
}